

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

cpool * cpool_get_instance(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if (data != (Curl_easy *)0x0) {
    if ((data->share != (Curl_share *)0x0) && ((data->share->specifier & 0x20) != 0)) {
      return &data->share->cpool;
    }
    if (data->multi_easy != (Curl_multi *)0x0) {
      return &data->multi_easy->cpool;
    }
    if (data->multi != (Curl_multi *)0x0) {
      return &data->multi->cpool;
    }
  }
  return (cpool *)0x0;
}

Assistant:

static struct cpool *cpool_get_instance(struct Curl_easy *data)
{
  if(data) {
    if(CURL_SHARE_KEEP_CONNECT(data->share))
      return &data->share->cpool;
    else if(data->multi_easy)
      return &data->multi_easy->cpool;
    else if(data->multi)
      return &data->multi->cpool;
  }
  return NULL;
}